

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O0

void __thiscall
capnp::TwoPartyVatNetwork::OutgoingMessageImpl::setFds(OutgoingMessageImpl *this,Array<int> *fds)

{
  Array<int> *other;
  Array<int> *fds_local;
  OutgoingMessageImpl *this_local;
  
  if (this->network->maxFdsPerMessage != 0) {
    other = kj::mv<kj::Array<int>>(fds);
    kj::Array<int>::operator=(&this->fds,other);
  }
  return;
}

Assistant:

void setFds(kj::Array<int> fds) override {
    if (network.maxFdsPerMessage > 0) {
      this->fds = kj::mv(fds);
    }
  }